

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionObjectStore.cpp
# Opt level: O0

void __thiscall
SessionObjectStore::getObjects
          (SessionObjectStore *this,CK_SLOT_ID slotID,
          set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *inObjects)

{
  bool bVar1;
  undefined1 uVar2;
  reference ppSVar3;
  MutexLocker *in_RDX;
  CK_SLOT_ID in_RSI;
  set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *in_RDI;
  iterator it;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffff68;
  MutexLocker *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff88;
  _Self local_40;
  _Base_ptr local_38;
  _Rb_tree_const_iterator<SessionObject_*> local_30 [3];
  MutexLocker *local_18;
  CK_SLOT_ID local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  MutexLocker::MutexLocker(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::_Rb_tree_const_iterator<SessionObject_*>::_Rb_tree_const_iterator(local_30);
  local_38 = (_Base_ptr)
             std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
             ::begin((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
                      *)in_stack_ffffffffffffff68);
  local_30[0]._M_node = local_38;
  while( true ) {
    local_40._M_node =
         (_Base_ptr)
         std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::
         end((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             in_stack_ffffffffffffff68);
    bVar1 = std::operator!=(local_30,&local_40);
    if (!bVar1) break;
    ppSVar3 = std::_Rb_tree_const_iterator<SessionObject_*>::operator*
                        ((_Rb_tree_const_iterator<SessionObject_*> *)in_stack_ffffffffffffff70);
    uVar2 = SessionObject::hasSlotID(*ppSVar3,local_10);
    if ((bool)uVar2) {
      in_stack_ffffffffffffff70 = local_18;
      std::_Rb_tree_const_iterator<SessionObject_*>::operator*
                ((_Rb_tree_const_iterator<SessionObject_*> *)local_18);
      std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::insert
                (in_RDI,(value_type *)CONCAT17(uVar2,in_stack_ffffffffffffff88));
    }
    std::_Rb_tree_const_iterator<SessionObject_*>::operator++
              ((_Rb_tree_const_iterator<SessionObject_*> *)in_stack_ffffffffffffff70);
  }
  MutexLocker::~MutexLocker(in_stack_ffffffffffffff70);
  return;
}

Assistant:

void SessionObjectStore::getObjects(CK_SLOT_ID slotID, std::set<OSObject*> &inObjects)
{
	// Make sure that no other thread is in the process of changing
	// the object list when we return it
	MutexLocker lock(storeMutex);

	std::set<SessionObject*>::iterator it;
	for (it=objects.begin(); it!=objects.end(); ++it) {
		if ((*it)->hasSlotID(slotID))
			inObjects.insert(*it);
	}
}